

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<short,_short,_bool,_duckdb::BinarySingleArgumentOperatorWrapper,_duckdb::NotEquals,_bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  bool bVar1;
  short *psVar2;
  short *psVar3;
  bool *pbVar4;
  undefined1 in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool in_stack_0000000f;
  bool *result_data;
  short *rdata;
  short *ldata;
  ValidityMask *in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc2;
  ushort right_00;
  short left_00;
  undefined1 fun_00;
  
  Vector::SetVectorType(in_RSI,(VectorType)((ulong)in_RDX >> 0x38));
  psVar2 = ConstantVector::GetData<short>((Vector *)0x2cecc44);
  psVar3 = ConstantVector::GetData<short>((Vector *)0x2cecc53);
  pbVar4 = ConstantVector::GetData<bool>((Vector *)0x2cecc62);
  bVar1 = ConstantVector::IsNull((Vector *)0x2cecc71);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0x2cecc7f), !bVar1)) {
    right_00 = CONCAT11(in_CL,in_stack_ffffffffffffffc2) & 0x1ff;
    left_00 = *psVar2;
    fun_00 = (undefined1)((ushort)*psVar3 >> 8);
    ConstantVector::Validity(in_RDX);
    bVar1 = BinarySingleArgumentOperatorWrapper::
            Operation<bool,_duckdb::NotEquals,_short,_short,_bool>
                      ((bool)fun_00,left_00,right_00,in_stack_ffffffffffffffb8,0x2ceccec);
    *pbVar4 = bVar1;
    return;
  }
  ConstantVector::SetNull((Vector *)result_data,in_stack_0000000f);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}